

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O2

XrResult xrEnumerateReferenceSpaces
                   (XrSession session,uint32_t spaceCapacityInput,uint32_t *spaceCountOutput,
                   XrReferenceSpaceType *spaces)

{
  XrResult XVar1;
  LoaderInstance *loader_instance;
  
  XVar1 = ActiveLoaderInstance::Get(&loader_instance,"xrEnumerateReferenceSpaces");
  if (XR_ERROR_VALIDATION_FAILURE < XVar1) {
    XVar1 = (*((loader_instance->_dispatch_table)._M_t.
               super___uniq_ptr_impl<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
               ._M_t.
               super__Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
               .super__Head_base<0UL,_XrGeneratedDispatchTableCore_*,_false>._M_head_impl)->
              EnumerateReferenceSpaces)(session,spaceCapacityInput,spaceCountOutput,spaces);
  }
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrEnumerateReferenceSpaces(
    XrSession                                   session,
    uint32_t                                    spaceCapacityInput,
    uint32_t*                                   spaceCountOutput,
    XrReferenceSpaceType*                       spaces) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrEnumerateReferenceSpaces");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->EnumerateReferenceSpaces(session, spaceCapacityInput, spaceCountOutput, spaces);
    }
    return result;
}